

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

bool __thiscall
arangodb::velocypack::Builder::closeCompactArrayOrObject
          (Builder *this,ValueLength pos,bool isArray,iterator indexStart,iterator indexEnd)

{
  ValueLength VVar1;
  pointer pCVar2;
  bool bVar3;
  long lVar4;
  byte *pbVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong len;
  ulong uVar12;
  
  uVar12 = (long)indexEnd._M_current - (long)indexStart._M_current >> 3;
  lVar10 = 1;
  len = 1;
  uVar9 = uVar12;
  if (0x7f < uVar12) {
    do {
      len = len + 1;
      bVar3 = 0x3fff < uVar9;
      uVar9 = uVar9 >> 7;
    } while (bVar3);
  }
  uVar9 = ((len - pos) + this->_pos) - 8;
  if (0x7f < uVar9) {
    lVar10 = 1;
    uVar11 = uVar9;
    do {
      lVar10 = lVar10 + 1;
      bVar3 = 0x3fff < uVar11;
      uVar11 = uVar11 >> 7;
    } while (bVar3);
  }
  uVar9 = uVar9 + lVar10;
  lVar4 = 1;
  uVar11 = uVar9;
  if (0x7f < uVar9) {
    do {
      lVar4 = lVar4 + 1;
      bVar3 = 0x3fff < uVar11;
      uVar11 = uVar11 >> 7;
    } while (bVar3);
  }
  uVar11 = lVar10 + (ulong)(lVar4 != lVar10);
  if (uVar11 < 9) {
    uVar9 = uVar9 + (lVar4 != lVar10);
    this->_start[pos] = '\x14' - isArray;
    __n = this->_pos - (pos + 9);
    if (pos + 9 <= this->_pos && __n != 0) {
      memmove(this->_start + uVar11 + pos + 1,this->_start + pos + 9,__n);
    }
    pbVar5 = this->_start + pos + 1;
    uVar7 = uVar9;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        pbVar5 = pbVar5 + 1;
        uVar8 = uVar7 >> 7;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar8;
    if (8 - uVar11 < len) {
      reserve(this,len);
    }
    pbVar5 = this->_start + uVar9 + pos + -1;
    uVar9 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar5 = (byte)uVar9 | 0x80;
        pbVar5 = pbVar5 + -1;
        uVar12 = uVar9 >> 7;
        bVar3 = 0x3fff < uVar9;
        uVar9 = uVar12;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar12;
    VVar1 = this->_bufferPtr->_size;
    this->_pos = (this->_pos + len + uVar11) - 8;
    this->_bufferPtr->_size = (VVar1 - 8) + len + uVar11;
    pCVar2 = (this->_stack).
             super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    VVar1 = pCVar2[-1].indexStartPos;
    (this->_stack).
    super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar2 + -1;
    puVar6 = (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + VVar1;
    if (puVar6 != (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
    }
  }
  return uVar11 < 9;
}

Assistant:

bool Builder::closeCompactArrayOrObject(
    ValueLength pos, bool isArray,
    std::vector<ValueLength>::iterator indexStart,
    std::vector<ValueLength>::iterator indexEnd) {
  std::size_t const n = std::distance(indexStart, indexEnd);

  // use compact notation
  ValueLength nLen = getVariableValueLength(static_cast<ValueLength>(n));
  VELOCYPACK_ASSERT(nLen > 0);
  ValueLength byteSize = _pos - (pos + 8) + nLen;
  VELOCYPACK_ASSERT(byteSize > 0);
  ValueLength bLen = getVariableValueLength(byteSize);
  byteSize += bLen;
  if (getVariableValueLength(byteSize) != bLen) {
    byteSize += 1;
    bLen += 1;
  }

  if (bLen < 9) {
    // can only use compact notation if total byte length is at most 8 bytes
    // long
    _start[pos] = (isArray ? 0x13 : 0x14);
    ValueLength targetPos = 1 + bLen;

    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }

    // store byte length
    VELOCYPACK_ASSERT(byteSize > 0);
    storeVariableValueLength<false>(_start + pos + 1, byteSize);

    // need additional memory for storing the number of values
    if (nLen > 8 - bLen) {
      reserve(nLen);
    }
    storeVariableValueLength<true>(_start + pos + byteSize - 1,
                                   static_cast<ValueLength>(n));

    rollback(8);
    advance(nLen + bLen);

    closeLevel();

#ifdef VELOCYPACK_DEBUG
    VELOCYPACK_ASSERT(_start[pos] == (isArray ? 0x13 : 0x14));
    VELOCYPACK_ASSERT(byteSize ==
                      readVariableValueLength<false>(_start + pos + 1));
    VELOCYPACK_ASSERT(isArray || _start[pos + 1 + bLen] != 0x00);
    VELOCYPACK_ASSERT(
        n == readVariableValueLength<true>(_start + pos + byteSize - 1));
#endif
    return true;
  }
  return false;
}